

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSVarRef * js_create_module_var(JSContext *ctx,BOOL is_lexical)

{
  int in_ESI;
  JSVarRef *var_ref;
  JSGCObjectHeader *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  JSContext *in_stack_ffffffffffffffd8;
  JSVarRef *local_8;
  
  local_8 = (JSVarRef *)
            js_malloc(in_stack_ffffffffffffffd8,
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_8 == (JSVarRef *)0x0) {
    local_8 = (JSVarRef *)0x0;
  }
  else {
    (local_8->field_0).header.ref_count = 1;
    if (in_ESI == 0) {
      in_stack_ffffffffffffffc0 = 0;
      (local_8->value).u.ptr = (void *)((ulong)in_stack_ffffffffffffffc4 << 0x20);
      (local_8->value).tag = 3;
    }
    else {
      (local_8->value).u.ptr = (void *)((ulong)in_stack_ffffffffffffffd4 << 0x20);
      (local_8->value).tag = 4;
    }
    local_8->pvalue = &local_8->value;
    (local_8->field_0).header.dummy1 = (local_8->field_0).header.dummy1 & 0xfe | 1;
    add_gc_object((JSRuntime *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,JS_GC_OBJ_TYPE_JS_OBJECT);
  }
  return local_8;
}

Assistant:

static JSVarRef *js_create_module_var(JSContext *ctx, BOOL is_lexical)
{
    JSVarRef *var_ref;
    var_ref = js_malloc(ctx, sizeof(JSVarRef));
    if (!var_ref)
        return NULL;
    var_ref->header.ref_count = 1;
    if (is_lexical)
        var_ref->value = JS_UNINITIALIZED;
    else
        var_ref->value = JS_UNDEFINED;
    var_ref->pvalue = &var_ref->value;
    var_ref->is_detached = TRUE;
    add_gc_object(ctx->rt, &var_ref->header, JS_GC_OBJ_TYPE_VAR_REF);
    return var_ref;
}